

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O0

float __thiscall MILBlob::Fp8E5M2::GetFloat(Fp8E5M2 *this)

{
  uint uVar1;
  FloatCast local_1c;
  Fp8E5M2 *pFStack_18;
  FloatCast fp32;
  Fp8E5M2 *this_local;
  
  pFStack_18 = this;
  memset(&local_1c,0,4);
  uVar1 = (uint)((this->data).byte >> 7) << 0x1f;
  local_1c.bytes = local_1c.bytes & 0x7fffffff | uVar1;
  if (((this->data).byte >> 2 & 0x1f) == 0x1f) {
    this_local._4_4_ = uVar1 | 0x7f800000 | (uint)((this->data).byte & 3);
  }
  else {
    HandleFp8ToFp32ExponentMantissa<MILBlob::Fp8E5M2,MILBlob::Fp8E5M2::Cast>(&this->data,&local_1c);
    HandleFp8ToFp32Denormalize<MILBlob::Fp8E5M2::Cast_const>(&this->data,&local_1c);
    this_local._4_4_ = local_1c.f;
  }
  return this_local._4_4_;
}

Assistant:

float Fp8E5M2::GetFloat() const
{
    FloatCast fp32 = {.f = 0};
    // Set the sign bit.
    fp32.components.sign = data.components.sign;

    // Standard NaN/Inf case. We just use the fp8 mantissa as there's
    // no strong requirements for mantissa in the NaN case.
    if (data.components.exponent == (0x1 << fp8ExponentBits) - 1) {
        fp32.components.exponent = 0xFF;
        fp32.components.mantissa = data.components.mantissa;
        return fp32.f;
    }
    HandleFp8ToFp32ExponentMantissa<Fp8E5M2, Fp8E5M2::Cast>(data, fp32);
    HandleFp8ToFp32Denormalize(data, fp32);
    return fp32.f;
}